

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOConcurrentAtomicCase::iterate
          (SSBOConcurrentAtomicCase *this)

{
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  value_type vVar1;
  glGetUniformLocationFunc p_Var2;
  glUseProgramFunc p_Var3;
  glUniform1uiFunc p_Var4;
  glBindBufferBaseFunc p_Var5;
  glBindBufferFunc p_Var6;
  GLint GVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  GLenum err;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  TestLog *pTVar12;
  MessageBuilder *pMVar13;
  TestError *this_01;
  reference value;
  GLuint *pGVar14;
  reference pvVar15;
  reference pvVar16;
  MessageBuilder local_1010;
  MessageBuilder local_e90;
  MessageBuilder local_d10;
  int local_b8c;
  undefined1 local_b88 [4];
  int logCallNdx;
  uint *local_a08;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a00;
  int local_9f8;
  deUint32 local_9f4;
  int callNdx_2;
  deUint32 errorExpected;
  deUint32 errorDelta;
  int invalidOperationNdx;
  int valueNdx;
  int callNdx_1;
  allocator<unsigned_int> local_859;
  undefined1 local_858 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> valueChain;
  undefined1 local_838 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  intermediateResults;
  MessageBuilder local_698;
  int local_514;
  undefined1 local_510 [4];
  int ndx;
  undefined1 local_390 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  int local_1f8;
  undefined1 local_1f2;
  allocator<char> local_1f1;
  int callNdx;
  MessageBuilder local_1d0;
  GLint local_50;
  int deltaLocation;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> deltas;
  deUint32 sumValue;
  Functions *gl;
  SSBOConcurrentAtomicCase *this_local;
  Functions *gl_00;
  
  pRVar11 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar9 = (*pRVar11->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar9);
  deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (this->m_numCalls * (this->m_numCalls + 1)) / 2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  generateShuffledRamp(this->m_numCalls,(vector<int,_std::allocator<int>_> *)local_40);
  p_Var2 = gl_00->getUniformLocation;
  dVar10 = glu::ShaderProgram::getProgram(this->m_program);
  local_50 = (*p_Var2)(dVar10,"u_atomicDelta");
  pTVar12 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1d0,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar13 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [16])"Running shader ");
  pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&this->m_numCalls);
  pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [9])0x2bf2e78);
  pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [15])"Num groups = (");
  pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&this->m_workSize);
  pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [9])", 1, 1)\n");
  pMVar13 = tcu::MessageBuilder::operator<<
                      (pMVar13,(char (*) [56])
                               "Setting u_atomicDelta to a unique value for each call.\n");
  tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  if (local_50 == -1) {
    local_1f2 = 1;
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&callNdx,"u_atomicDelta location was -1",&local_1f1);
    tcu::TestError::TestError(this_01,(string *)&callNdx);
    local_1f2 = 0;
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  p_Var3 = gl_00->useProgram;
  dVar10 = glu::ShaderProgram::getProgram(this->m_program);
  (*p_Var3)(dVar10);
  (*gl_00->bindBufferBase)(0x90d2,2,this->m_bufferID);
  for (local_1f8 = 0; local_1f8 < this->m_numCalls; local_1f8 = local_1f8 + 1) {
    pTVar12 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)
               &result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pTVar12,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)
                         &result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [6])"Call ");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_1f8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [19])": u_atomicDelta = ");
    value = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_40,(long)local_1f8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,value);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder
              ((MessageBuilder *)
               &result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    GVar7 = local_50;
    p_Var4 = gl_00->uniform1ui;
    pGVar14 = (GLuint *)
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_40,(long)local_1f8);
    (*p_Var4)(GVar7,*pGVar14);
    p_Var5 = gl_00->bindBufferBase;
    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->m_intermediateResultBuffers,(long)local_1f8);
    (*p_Var5)(0x90d2,1,*pvVar15);
    (*gl_00->dispatchCompute)(this->m_workSize,1,1);
  }
  err = (*gl_00->getError)();
  glu::checkError(err,"post dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x8d5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_390);
  pTVar12 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_510,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar13 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_510,
                       (char (*) [55])"Verifying work buffer, it should be filled with value ");
  pMVar13 = tcu::MessageBuilder::operator<<
                      (pMVar13,(uint *)((long)&deltas.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                       ));
  tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_510);
  (*gl_00->bindBuffer)(0x90d2,this->m_bufferID);
  readBuffer(gl_00,0x90d2,this->m_workSize,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_390);
  for (local_514 = 0; local_514 < this->m_workSize; local_514 = local_514 + 1) {
    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_390,
                         (long)local_514);
    if (*pvVar15 !=
        deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_) {
      pTVar12 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_698,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar13 = tcu::MessageBuilder::operator<<
                          (&local_698,(char (*) [29])"Work buffer error, at index ");
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_514);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [17])0x2c04733);
      pMVar13 = tcu::MessageBuilder::operator<<
                          (pMVar13,(uint *)((long)&deltas.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [7])0x2c59494);
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_390,
                           (long)local_514);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,pvVar15);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x2b8f97b);
      pMVar13 = tcu::MessageBuilder::operator<<
                          (pMVar13,(char (*) [37])"Work buffer contains invalid values.");
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_698);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Buffer contents invalid");
      this_local._4_4_ = STOP;
      bVar8 = true;
      goto LAB_0216b6fe;
    }
  }
  pTVar12 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)
             &intermediateResults.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar12,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar13 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)
                       &intermediateResults.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (char (*) [32])"Work buffer contents are valid.");
  tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)
             &intermediateResults.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar8 = false;
LAB_0216b6fe:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_390);
  if (!bVar8) {
    iVar9 = this->m_numCalls;
    this_00 = (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              ((long)&valueChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(this_00);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_838,(long)iVar9,this_00);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               ((long)&valueChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    iVar9 = this->m_numCalls;
    std::allocator<unsigned_int>::allocator(&local_859);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_858,(long)iVar9,
               &local_859);
    std::allocator<unsigned_int>::~allocator(&local_859);
    pTVar12 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&valueNdx,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&valueNdx,
                         (char (*) [33])"Verifying intermediate results. ");
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&valueNdx);
    for (invalidOperationNdx = 0; invalidOperationNdx < this->m_numCalls;
        invalidOperationNdx = invalidOperationNdx + 1) {
      p_Var6 = gl_00->bindBuffer;
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_intermediateResultBuffers,(long)invalidOperationNdx);
      (*p_Var6)(0x90d2,*pvVar15);
      iVar9 = this->m_workSize;
      pvVar16 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)local_838,(long)invalidOperationNdx);
      readBuffer(gl_00,0x90d2,iVar9,pvVar16);
    }
    errorDelta = 0;
LAB_0216b972:
    if ((int)errorDelta < this->m_workSize) {
      for (local_9f8 = 0; local_9f8 < this->m_numCalls; local_9f8 = local_9f8 + 1) {
        pvVar16 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)local_838,(long)local_9f8);
        pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar16,(long)(int)errorDelta);
        vVar1 = *pvVar15;
        pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_858,
                             (long)local_9f8);
        *pvVar15 = vVar1;
      }
      local_a00._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_858);
      local_a08 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     local_858);
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (local_a00,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_a08);
      bVar8 = validateSortedAtomicRampAdditionValueChain
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_858,
                         deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,(int *)&errorExpected,
                         (deUint32 *)&callNdx_2,&local_9f4);
      if (bVar8) goto LAB_0216be27;
      pTVar12 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_b88,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar13 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_b88,
                           (char (*) [43])"Intermediate buffer error, at value index ");
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(int *)&errorDelta);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [27])0x2c047c5);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(int *)&errorExpected);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [26])", value was increased by ");
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(uint *)&callNdx_2);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [16])", but expected ");
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_9f4);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [3])0x2c7b265);
      pMVar13 = tcu::MessageBuilder::operator<<
                          (pMVar13,(char (*) [62])
                                   "Intermediate buffer contains invalid values. Values at index ");
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(int *)&errorDelta);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x2b8f97b);
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_b88);
      for (local_b8c = 0; local_b8c < this->m_numCalls; local_b8c = local_b8c + 1) {
        pTVar12 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_d10,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar13 = tcu::MessageBuilder::operator<<(&local_d10,(char (*) [7])"Value[");
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_b8c);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [5])0x2bbcf58);
        pvVar16 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)local_838,(long)local_b8c);
        pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar16,(long)(int)errorDelta);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,pvVar15);
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_d10);
      }
      pTVar12 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_e90,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar13 = tcu::MessageBuilder::operator<<(&local_e90,(char (*) [10])0x2a955f4);
      pMVar13 = tcu::MessageBuilder::operator<<
                          (pMVar13,(uint *)((long)&deltas.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_e90);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Buffer contents invalid");
      this_local._4_4_ = STOP;
      bVar8 = true;
    }
    else {
      pTVar12 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1010,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar13 = tcu::MessageBuilder::operator<<
                          (&local_1010,(char (*) [32])"Intermediate buffers are valid.");
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1010);
      bVar8 = false;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_858);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_838);
    if (!bVar8) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      this_local._4_4_ = STOP;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return this_local._4_4_;
LAB_0216be27:
  errorDelta = errorDelta + 1;
  goto LAB_0216b972;
}

Assistant:

TestCase::IterateResult SSBOConcurrentAtomicCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const deUint32			sumValue		= (deUint32)(m_numCalls * (m_numCalls + 1) / 2);
	std::vector<int>		deltas;

	// generate unique deltas
	generateShuffledRamp(m_numCalls, deltas);

	// invoke program N times, each with a different delta
	{
		const int deltaLocation = gl.getUniformLocation(m_program->getProgram(), "u_atomicDelta");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Running shader " << m_numCalls << " times.\n"
			<< "Num groups = (" << m_workSize << ", 1, 1)\n"
			<< "Setting u_atomicDelta to a unique value for each call.\n"
			<< tcu::TestLog::EndMessage;

		if (deltaLocation == -1)
			throw tcu::TestError("u_atomicDelta location was -1");

		gl.useProgram(m_program->getProgram());
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_bufferID);

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Call " << callNdx << ": u_atomicDelta = " << deltas[callNdx]
				<< tcu::TestLog::EndMessage;

			gl.uniform1ui(deltaLocation, deltas[callNdx]);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_intermediateResultBuffers[callNdx]);
			gl.dispatchCompute(m_workSize, 1, 1);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "post dispatch");
	}

	// Verify result
	{
		std::vector<deUint32> result;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying work buffer, it should be filled with value " << sumValue << tcu::TestLog::EndMessage;

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_bufferID);
		readBuffer(gl, GL_SHADER_STORAGE_BUFFER, m_workSize, result);

		for (int ndx = 0; ndx < m_workSize; ++ndx)
		{
			if (result[ndx] != sumValue)
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Work buffer error, at index " << ndx << " expected value " << (sumValue) << ", got " << result[ndx] << "\n"
					<< "Work buffer contains invalid values."
					<< tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Work buffer contents are valid." << tcu::TestLog::EndMessage;
	}

	// verify steps
	{
		std::vector<std::vector<deUint32> >	intermediateResults	(m_numCalls);
		std::vector<deUint32>				valueChain			(m_numCalls);

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying intermediate results. " << tcu::TestLog::EndMessage;

		// collect results

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_intermediateResultBuffers[callNdx]);
			readBuffer(gl, GL_SHADER_STORAGE_BUFFER, m_workSize, intermediateResults[callNdx]);
		}

		// verify values

		for (int valueNdx = 0; valueNdx < m_workSize; ++valueNdx)
		{
			int			invalidOperationNdx;
			deUint32	errorDelta;
			deUint32	errorExpected;

			// collect result chain for each element
			for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
				valueChain[callNdx] = intermediateResults[callNdx][valueNdx];

			// check there exists a path from 0 to sumValue using each addition once
			// decompose cumulative results to addition operations (all additions positive => this works)

			std::sort(valueChain.begin(), valueChain.end());

			// validate chain
			if (!validateSortedAtomicRampAdditionValueChain(valueChain, sumValue, invalidOperationNdx, errorDelta, errorExpected))
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Intermediate buffer error, at value index " << valueNdx << ", applied operation index " << invalidOperationNdx << ", value was increased by " << errorDelta << ", but expected " << errorExpected << ".\n"
					<< "Intermediate buffer contains invalid values. Values at index " << valueNdx << "\n"
					<< tcu::TestLog::EndMessage;

				for (int logCallNdx = 0; logCallNdx < m_numCalls; ++logCallNdx)
					m_testCtx.getLog() << tcu::TestLog::Message << "Value[" << logCallNdx << "] = " << intermediateResults[logCallNdx][valueNdx] << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Message << "Result = " << sumValue << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Intermediate buffers are valid." << tcu::TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}